

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O0

Value * __thiscall iqxmlrpc::Value::operator[](Value *this,char *s)

{
  char *__s;
  Struct *this_00;
  Value *pVVar1;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *s_local;
  Value *this_local;
  
  local_18 = s;
  s_local = (char *)this;
  this_00 = cast<iqxmlrpc::Struct>(this);
  __s = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  pVVar1 = Struct::operator[](this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return pVVar1;
}

Assistant:

Value& Value::operator []( const char* s )
{
  return (*cast<Struct>())[s];
}